

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi_serial_unix.cxx
# Opt level: O2

int ndiSerialWrite(int serial_port,char *text,int n)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  int iVar4;
  
  iVar4 = 0;
  do {
    if (n < 1) {
      return iVar4;
    }
    sVar2 = write(serial_port,text + iVar4,(ulong)(uint)n);
    iVar1 = (int)sVar2;
    if (iVar1 == -1) {
      piVar3 = __errno_location();
      iVar1 = 0;
      if (*piVar3 != 0xb) {
        return -1;
      }
    }
    n = n - iVar1;
    iVar4 = iVar4 + iVar1;
  } while( true );
}

Assistant:

ndicapiExport int ndiSerialWrite(int serial_port, const char* text, int n)
{
  int i = 0;
  int m;

  while (n > 0)
  {
    if ((m = write(serial_port, &text[i], n)) == -1)
    {
      if (errno == EAGAIN)   /* system canceled us, retry */
      {
        m = 0;
      }
      else
      {
        return -1;  /* IO error occurred */
      }
    }

    n -= m;  /* n is number of chars left to write */
    i += m;  /* i is the number of chars written */
  }

  return i;  /* return the number of characters written */
}